

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADIOS.cpp
# Opt level: O2

IO __thiscall adios2::ADIOS::AtIO(ADIOS *this,string *name)

{
  element_type *peVar1;
  IO *io;
  IO local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_38,"for io name ",name);
  std::operator+(&local_78,&local_38,", in call to ADIOS::AtIO");
  CheckPointer(this,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_38);
  peVar1 = (this->m_ADIOS).super___shared_ptr<adios2::core::ADIOS,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  std::__cxx11::string::string(local_58,(string *)name);
  io = (IO *)adios2::core::ADIOS::AtIO(peVar1,local_58);
  IO::IO(&local_80,io);
  std::__cxx11::string::~string(local_58);
  return (IO)local_80.m_IO;
}

Assistant:

IO ADIOS::AtIO(const std::string name)
{
    CheckPointer("for io name " + name + ", in call to ADIOS::AtIO");
    return IO(&m_ADIOS->AtIO(name));
}